

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.cpp
# Opt level: O2

void duckdb::TimeTZAverageOperation::
     Finalize<duckdb::dtime_tz_t,duckdb::AvgState<duckdb::hugeint_t>>
               (AvgState<duckdb::hugeint_t> *state,dtime_tz_t *target,
               AggregateFinalizeData *finalize_data)

{
  long lVar1;
  uint64_t *in_R8;
  hugeint_t hVar2;
  uint64_t remainder;
  ulong local_20;
  
  if (state->count != 0) {
    hVar2.upper = state->count;
    hVar2.lower = (state->value).upper;
    hVar2 = Hugeint::DivModPositive((Hugeint *)(state->value).lower,hVar2,(uint64_t)&local_20,in_R8)
    ;
    lVar1 = Hugeint::Cast<long>(hVar2);
    target->bits = (lVar1 + (ulong)(state->count >> 1 < local_20)) * 0x1000000 | 0xe0ff;
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.count == 0) {
			finalize_data.ReturnNull();
		} else {
			uint64_t remainder;
			auto micros = Hugeint::Cast<int64_t>(Hugeint::DivModPositive(state.value, state.count, remainder));
			// Round the result
			micros += (remainder > (state.count / 2));
			target = dtime_tz_t(dtime_t(micros), 0);
		}
	}